

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_streams.c
# Opt level: O2

HPDF_STATUS HPDF_MemStream_InWrite(HPDF_Stream stream,HPDF_BYTE **ptr,HPDF_UINT *count)

{
  uint uVar1;
  undefined8 *puVar2;
  void *item;
  HPDF_STATUS HVar3;
  uint n;
  HPDF_UINT size;
  
  uVar1 = *count;
  if (uVar1 != 0) {
    puVar2 = (undefined8 *)stream->attr;
    size = *(HPDF_UINT *)(puVar2 + 1);
    n = size - *(HPDF_UINT *)((long)puVar2 + 0xc);
    if (n < uVar1) {
      if (size != *(HPDF_UINT *)((long)puVar2 + 0xc)) {
        HPDF_MemCpy((HPDF_BYTE *)puVar2[2],*ptr,n);
        *ptr = *ptr + n;
        *count = *count - n;
        size = *(HPDF_UINT *)(puVar2 + 1);
      }
      item = HPDF_GetMem(stream->mmgr,size);
      puVar2[2] = item;
      if (item != (void *)0x0) {
        HVar3 = HPDF_List_Add((HPDF_List)*puVar2,item);
        if (HVar3 == 0) {
          *(undefined4 *)((long)puVar2 + 0xc) = 0;
          return 0;
        }
        HPDF_FreeMem(stream->mmgr,(void *)puVar2[2]);
        puVar2[2] = 0;
      }
      HVar3 = HPDF_Error_GetCode(stream->error);
      return HVar3;
    }
    HPDF_MemCpy((HPDF_BYTE *)puVar2[2],*ptr,uVar1);
    uVar1 = *count;
    puVar2[2] = puVar2[2] + (ulong)uVar1;
    *(int *)((long)puVar2 + 0xc) = *(int *)((long)puVar2 + 0xc) + uVar1;
    *count = 0;
  }
  return 0;
}

Assistant:

HPDF_STATUS
HPDF_MemStream_InWrite  (HPDF_Stream      stream,
                         const HPDF_BYTE  **ptr,
                         HPDF_UINT        *count)
{
    HPDF_MemStreamAttr attr = (HPDF_MemStreamAttr)stream->attr;
    HPDF_UINT rsize = attr->buf_siz - attr->w_pos;

    HPDF_PTRACE((" HPDF_MemStream_InWrite\n"));

    if (*count <= 0)
        return HPDF_OK;

    if (rsize >= *count) {
        HPDF_MemCpy (attr->w_ptr, *ptr, *count);
        attr->w_ptr += *count;
        attr->w_pos += *count;
        *count = 0;
    } else {
        if (rsize > 0) {
            HPDF_MemCpy (attr->w_ptr, *ptr, rsize);
            *ptr += rsize;
            *count -= rsize;
        }
        attr->w_ptr = (HPDF_BYTE*)HPDF_GetMem (stream->mmgr, attr->buf_siz);

        if (attr->w_ptr == NULL)
           return HPDF_Error_GetCode (stream->error);

        if (HPDF_List_Add (attr->buf, attr->w_ptr) != HPDF_OK) {
            HPDF_FreeMem (stream->mmgr, attr->w_ptr);
            attr->w_ptr = NULL;

            return HPDF_Error_GetCode (stream->error);
        }
        attr->w_pos = 0;
    }
    return HPDF_OK;
}